

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::Perform
          (Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  ArgumentTuple *args_local;
  Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  bVar1 = internal::
          Apply<std::function<bool(solitaire::archivers::interfaces::Snapshot_const&)>const&,std::tuple<solitaire::archivers::interfaces::Snapshot_const&>>
                    (&this->fun_,args);
  return bVar1;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }